

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx2::
     BVHNIntersectorKHybrid<8,_8,_1,_false,_embree::avx2::ArrayIntersectorK_1<8,_embree::avx2::QuadMvIntersectorKMoeller<4,_8,_false>_>,_true>
     ::occluded(vint<8> *valid_i,Intersectors *This,RayK<8> *ray,RayQueryContext *context)

{
  RayK<8> *pRVar1;
  RayK<8> *pRVar2;
  RayK<8> *pRVar3;
  RayK<8> *pRVar4;
  float fVar5;
  float fVar6;
  undefined1 auVar7 [16];
  float fVar8;
  float fVar9;
  float fVar10;
  undefined4 uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [24];
  undefined1 auVar41 [24];
  undefined1 auVar42 [24];
  undefined1 auVar43 [24];
  undefined1 auVar44 [24];
  undefined1 auVar45 [24];
  int iVar46;
  ulong uVar47;
  undefined4 uVar48;
  RayK<8> *pRVar49;
  long lVar50;
  ulong uVar51;
  undefined1 (*pauVar52) [32];
  ulong uVar53;
  ulong *puVar54;
  NodeRef root;
  uint uVar55;
  bool bVar56;
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [16];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar68 [36];
  undefined1 auVar67 [64];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 in_ZMM2 [64];
  undefined1 auVar75 [36];
  undefined1 auVar74 [64];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [64];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  float fVar98;
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [64];
  undefined1 auVar110 [64];
  undefined1 auVar111 [64];
  undefined1 auVar112 [32];
  undefined1 in_ZMM13 [64];
  uint uVar113;
  uint uVar114;
  uint uVar115;
  uint uVar116;
  undefined4 uVar117;
  undefined4 uVar118;
  uint uVar119;
  undefined1 in_ZMM15 [64];
  Precalculations pre;
  vbool<8> terminated;
  TravRayK<8,_false> tray;
  NodeRef stack_node [561];
  vfloat<8> stack_near [561];
  Precalculations local_5d91;
  BVH *local_5d90;
  Intersectors *local_5d88;
  undefined1 local_5d80 [32];
  undefined1 local_5d60 [32];
  undefined1 local_5d40 [32];
  RayK<8> *local_5d18;
  RayQueryContext *local_5d10;
  RayK<8> *local_5d08;
  undefined1 local_5d00 [32];
  uint local_5ce0;
  undefined4 uStack_5cdc;
  undefined8 uStack_5cd8;
  undefined8 uStack_5cd0;
  undefined8 uStack_5cc8;
  undefined1 local_5cc0 [32];
  size_t local_5ca0;
  undefined8 uStack_5c98;
  undefined8 uStack_5c90;
  undefined8 uStack_5c88;
  undefined1 local_5c80 [8];
  float fStack_5c78;
  float fStack_5c74;
  float fStack_5c70;
  float fStack_5c6c;
  float fStack_5c68;
  float fStack_5c64;
  undefined1 local_5c60 [8];
  float fStack_5c58;
  float fStack_5c54;
  float fStack_5c50;
  float fStack_5c4c;
  float fStack_5c48;
  float fStack_5c44;
  undefined1 local_5c40 [8];
  float fStack_5c38;
  float fStack_5c34;
  float fStack_5c30;
  float fStack_5c2c;
  float fStack_5c28;
  float fStack_5c24;
  undefined1 local_5c20 [32];
  undefined8 local_5c00;
  undefined8 uStack_5bf8;
  undefined8 uStack_5bf0;
  undefined8 uStack_5be8;
  undefined8 local_5be0;
  undefined8 uStack_5bd8;
  undefined8 uStack_5bd0;
  undefined8 uStack_5bc8;
  undefined8 local_5bc0;
  undefined8 uStack_5bb8;
  undefined8 uStack_5bb0;
  undefined8 uStack_5ba8;
  undefined8 local_5ba0;
  undefined8 uStack_5b98;
  undefined8 uStack_5b90;
  undefined8 uStack_5b88;
  undefined8 local_5b80;
  undefined8 uStack_5b78;
  undefined8 uStack_5b70;
  undefined8 uStack_5b68;
  undefined8 local_5b60;
  undefined8 uStack_5b58;
  undefined8 uStack_5b50;
  undefined8 uStack_5b48;
  undefined1 local_5b40 [32];
  undefined1 local_5b20 [32];
  undefined1 local_5b00 [32];
  undefined1 local_5ae0 [32];
  undefined1 local_5ac0 [32];
  float local_5aa0;
  float fStack_5a9c;
  float fStack_5a98;
  float fStack_5a94;
  float fStack_5a90;
  float fStack_5a8c;
  float fStack_5a88;
  float fStack_5a84;
  float local_5a80;
  float fStack_5a7c;
  float fStack_5a78;
  float fStack_5a74;
  float fStack_5a70;
  float fStack_5a6c;
  float fStack_5a68;
  float fStack_5a64;
  float local_5a60;
  float fStack_5a5c;
  float fStack_5a58;
  float fStack_5a54;
  float fStack_5a50;
  float fStack_5a4c;
  float fStack_5a48;
  float fStack_5a44;
  anon_union_96_2_4062524c_for_Vec3<embree::vfloat_impl<8>_>_1 local_5a40;
  undefined1 local_59e0 [32];
  undefined1 local_59c0 [32];
  undefined1 local_59a0 [32];
  undefined1 local_5980 [32];
  undefined1 local_5960 [32];
  undefined1 local_5940 [32];
  float local_5920;
  float fStack_591c;
  float fStack_5918;
  float fStack_5914;
  float fStack_5910;
  float fStack_590c;
  float fStack_5908;
  undefined4 uStack_5904;
  float local_5900;
  float fStack_58fc;
  float fStack_58f8;
  float fStack_58f4;
  float fStack_58f0;
  float fStack_58ec;
  float fStack_58e8;
  undefined4 uStack_58e4;
  float local_58e0;
  float fStack_58dc;
  float fStack_58d8;
  float fStack_58d4;
  float fStack_58d0;
  float fStack_58cc;
  float fStack_58c8;
  undefined4 uStack_58c4;
  undefined1 local_58c0 [32];
  undefined1 local_58a0 [32];
  undefined1 local_5880 [32];
  undefined1 local_5860 [32];
  undefined1 local_5840 [32];
  undefined8 local_5810;
  size_t local_5808;
  ulong local_5800 [560];
  undefined1 local_4680 [32];
  undefined1 local_4660 [32];
  undefined1 local_4640 [17936];
  
  local_5d90 = (BVH *)This->ptr;
  local_5808 = (local_5d90->root).ptr;
  if (local_5808 != 8) {
    if ((context->user == (RTCRayQueryContext *)0x0) ||
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) == RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      auVar73 = vpcmpeqd_avx2(in_ZMM2._0_32_,in_ZMM2._0_32_);
      auVar60 = ZEXT816(0) << 0x40;
      auVar82 = vpcmpeqd_avx2(auVar73,(undefined1  [32])valid_i->field_0);
      auVar73 = vcmpps_avx(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(auVar60),5);
      auVar61 = auVar82 & auVar73;
      if ((((((((auVar61 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar61 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar61 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar61 >> 0x7f,0) != '\0') ||
            (auVar61 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar61 >> 0xbf,0) != '\0') ||
          (auVar61 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar61[0x1f] < '\0') {
        auVar73 = vandps_avx(auVar73,auVar82);
        local_5a40._0_4_ = *(undefined4 *)ray;
        local_5a40._4_4_ = *(undefined4 *)(ray + 4);
        local_5a40._8_4_ = *(undefined4 *)(ray + 8);
        local_5a40._12_4_ = *(undefined4 *)(ray + 0xc);
        local_5a40._16_4_ = *(undefined4 *)(ray + 0x10);
        local_5a40._20_4_ = *(undefined4 *)(ray + 0x14);
        local_5a40._24_4_ = *(undefined4 *)(ray + 0x18);
        local_5a40._28_4_ = *(undefined4 *)(ray + 0x1c);
        local_5a40._32_4_ = *(undefined4 *)(ray + 0x20);
        local_5a40._36_4_ = *(undefined4 *)(ray + 0x24);
        local_5a40._40_4_ = *(undefined4 *)(ray + 0x28);
        local_5a40._44_4_ = *(undefined4 *)(ray + 0x2c);
        local_5a40._48_4_ = *(undefined4 *)(ray + 0x30);
        local_5a40._52_4_ = *(undefined4 *)(ray + 0x34);
        local_5a40._56_4_ = *(undefined4 *)(ray + 0x38);
        local_5a40._60_4_ = *(undefined4 *)(ray + 0x3c);
        local_5a40._64_4_ = *(undefined4 *)(ray + 0x40);
        local_5a40._68_4_ = *(undefined4 *)(ray + 0x44);
        local_5a40._72_4_ = *(undefined4 *)(ray + 0x48);
        local_5a40._76_4_ = *(undefined4 *)(ray + 0x4c);
        local_5a40._80_4_ = *(undefined4 *)(ray + 0x50);
        local_5a40._84_4_ = *(undefined4 *)(ray + 0x54);
        local_5a40._88_4_ = *(undefined4 *)(ray + 0x58);
        local_5a40._92_4_ = *(undefined4 *)(ray + 0x5c);
        local_59e0 = *(undefined1 (*) [32])(ray + 0x80);
        local_59c0 = *(undefined1 (*) [32])(ray + 0xa0);
        local_59a0 = *(undefined1 (*) [32])(ray + 0xc0);
        local_5c20._8_4_ = 0x7fffffff;
        local_5c20._0_8_ = 0x7fffffff7fffffff;
        local_5c20._12_4_ = 0x7fffffff;
        local_5c20._16_4_ = 0x7fffffff;
        local_5c20._20_4_ = 0x7fffffff;
        local_5c20._24_4_ = 0x7fffffff;
        local_5c20._28_4_ = 0x7fffffff;
        auVar107._8_4_ = 0x219392ef;
        auVar107._0_8_ = 0x219392ef219392ef;
        auVar107._12_4_ = 0x219392ef;
        auVar107._16_4_ = 0x219392ef;
        auVar107._20_4_ = 0x219392ef;
        auVar107._24_4_ = 0x219392ef;
        auVar107._28_4_ = 0x219392ef;
        auVar61 = vandps_avx(local_5c20,local_59e0);
        auVar61 = vcmpps_avx(auVar61,auVar107,1);
        auVar82 = vblendvps_avx(local_59e0,auVar107,auVar61);
        auVar61 = vandps_avx(local_5c20,local_59c0);
        auVar61 = vcmpps_avx(auVar61,auVar107,1);
        auVar83 = vblendvps_avx(local_59c0,auVar107,auVar61);
        auVar61 = vandps_avx(local_59a0,local_5c20);
        auVar61 = vcmpps_avx(auVar61,auVar107,1);
        auVar61 = vblendvps_avx(local_59a0,auVar107,auVar61);
        auVar7 = vpackssdw_avx(auVar73._0_16_,auVar73._16_16_);
        auVar73 = vrcpps_avx(auVar82);
        auVar105._8_4_ = 0x3f800000;
        auVar105._0_8_ = 0x3f8000003f800000;
        auVar105._12_4_ = 0x3f800000;
        auVar105._16_4_ = 0x3f800000;
        auVar105._20_4_ = 0x3f800000;
        auVar105._24_4_ = 0x3f800000;
        auVar105._28_4_ = 0x3f800000;
        auVar15 = vfnmadd213ps_fma(auVar82,auVar73,auVar105);
        auVar15 = vfmadd132ps_fma(ZEXT1632(auVar15),auVar73,auVar73);
        auVar73 = vrcpps_avx(auVar83);
        auVar16 = vfnmadd213ps_fma(auVar83,auVar73,auVar105);
        auVar82 = vrcpps_avx(auVar61);
        auVar16 = vfmadd132ps_fma(ZEXT1632(auVar16),auVar73,auVar73);
        auVar17 = vfnmadd213ps_fma(auVar61,auVar82,auVar105);
        auVar17 = vfmadd132ps_fma(ZEXT1632(auVar17),auVar82,auVar82);
        local_5980 = ZEXT1632(auVar15);
        local_5960 = ZEXT1632(auVar16);
        local_5940 = ZEXT1632(auVar17);
        local_5920 = auVar15._0_4_ * (float)local_5a40._0_4_;
        fStack_591c = auVar15._4_4_ * (float)local_5a40._4_4_;
        fStack_5918 = auVar15._8_4_ * (float)local_5a40._8_4_;
        fStack_5914 = auVar15._12_4_ * (float)local_5a40._12_4_;
        fStack_5910 = (float)local_5a40._16_4_ * 0.0;
        fStack_590c = (float)local_5a40._20_4_ * 0.0;
        fStack_5908 = (float)local_5a40._24_4_ * 0.0;
        local_5900 = (float)local_5a40._32_4_ * auVar16._0_4_;
        fStack_58fc = (float)local_5a40._36_4_ * auVar16._4_4_;
        fStack_58f8 = (float)local_5a40._40_4_ * auVar16._8_4_;
        fStack_58f4 = (float)local_5a40._44_4_ * auVar16._12_4_;
        fStack_58f0 = (float)local_5a40._48_4_ * 0.0;
        fStack_58ec = (float)local_5a40._52_4_ * 0.0;
        fStack_58e8 = (float)local_5a40._56_4_ * 0.0;
        local_58e0 = (float)local_5a40._64_4_ * auVar17._0_4_;
        fStack_58dc = (float)local_5a40._68_4_ * auVar17._4_4_;
        fStack_58d8 = (float)local_5a40._72_4_ * auVar17._8_4_;
        fStack_58d4 = (float)local_5a40._76_4_ * auVar17._12_4_;
        fStack_58d0 = (float)local_5a40._80_4_ * 0.0;
        fStack_58cc = (float)local_5a40._84_4_ * 0.0;
        fStack_58c8 = (float)local_5a40._88_4_ * 0.0;
        auVar73 = vcmpps_avx(local_5980,ZEXT1632(auVar60),1);
        auVar82._8_4_ = 0x20;
        auVar82._0_8_ = 0x2000000020;
        auVar82._12_4_ = 0x20;
        auVar82._16_4_ = 0x20;
        auVar82._20_4_ = 0x20;
        auVar82._24_4_ = 0x20;
        auVar82._28_4_ = 0x20;
        local_58c0 = vandps_avx(auVar73,auVar82);
        auVar61 = ZEXT1632(auVar60);
        auVar73 = vcmpps_avx(ZEXT1632(auVar16),auVar61,5);
        auVar83._8_4_ = 0x40;
        auVar83._0_8_ = 0x4000000040;
        auVar83._12_4_ = 0x40;
        auVar83._16_4_ = 0x40;
        auVar83._20_4_ = 0x40;
        auVar83._24_4_ = 0x40;
        auVar83._28_4_ = 0x40;
        auVar88._8_4_ = 0x60;
        auVar88._0_8_ = 0x6000000060;
        auVar88._12_4_ = 0x60;
        auVar88._16_4_ = 0x60;
        auVar88._20_4_ = 0x60;
        auVar88._24_4_ = 0x60;
        auVar88._28_4_ = 0x60;
        local_58a0 = vblendvps_avx(auVar88,auVar83,auVar73);
        auVar73 = vcmpps_avx(ZEXT1632(auVar17),auVar61,5);
        auVar84._8_4_ = 0x80;
        auVar84._0_8_ = 0x8000000080;
        auVar84._12_4_ = 0x80;
        auVar84._16_4_ = 0x80;
        auVar84._20_4_ = 0x80;
        auVar84._24_4_ = 0x80;
        auVar84._28_4_ = 0x80;
        auVar89._8_4_ = 0xa0;
        auVar89._0_8_ = 0xa0000000a0;
        auVar89._12_4_ = 0xa0;
        auVar89._16_4_ = 0xa0;
        auVar89._20_4_ = 0xa0;
        auVar89._24_4_ = 0xa0;
        auVar89._28_4_ = 0xa0;
        local_5880 = vblendvps_avx(auVar89,auVar84,auVar73);
        auVar73 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x60),auVar61);
        local_5b40 = vpmovsxwd_avx2(auVar7);
        local_4680._8_4_ = 0x7f800000;
        local_4680._0_8_ = 0x7f8000007f800000;
        local_4680._12_4_ = 0x7f800000;
        local_4680._16_4_ = 0x7f800000;
        local_4680._20_4_ = 0x7f800000;
        local_4680._24_4_ = 0x7f800000;
        local_4680._28_4_ = 0x7f800000;
        auVar109 = ZEXT3264(local_4680);
        local_5860 = vblendvps_avx(local_4680,auVar73,local_5b40);
        auVar73 = vmaxps_avx(*(undefined1 (*) [32])(ray + 0x100),auVar61);
        auVar61._8_4_ = 0xff800000;
        auVar61._0_8_ = 0xff800000ff800000;
        auVar61._12_4_ = 0xff800000;
        auVar61._16_4_ = 0xff800000;
        auVar61._20_4_ = 0xff800000;
        auVar61._24_4_ = 0xff800000;
        auVar61._28_4_ = 0xff800000;
        local_5840 = vblendvps_avx(auVar61,auVar73,local_5b40);
        auVar60 = vpcmpeqd_avx(local_5840._0_16_,local_5840._0_16_);
        local_5d00 = vpmovsxwd_avx2(auVar7 ^ auVar60);
        if (context->user == (RTCRayQueryContext *)0x0) {
          uVar55 = 7;
        }
        else {
          uVar55 = (uint)((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                         RTC_RAY_QUERY_FLAG_INCOHERENT) * 5 + 2;
        }
        pRVar49 = ray + 0x100;
        puVar54 = local_5800;
        local_5810 = 0xfffffffffffffff8;
        pauVar52 = (undefined1 (*) [32])local_4640;
        local_4660 = local_5860;
        auVar73 = vpcmpeqd_avx2(local_5c20,local_5c20);
        auVar110 = ZEXT3264(auVar73);
        local_5d08 = pRVar49;
        uStack_5904 = local_5a40._28_4_;
        uStack_58e4 = local_5a40._60_4_;
        uStack_58c4 = local_5a40._92_4_;
LAB_00604fe9:
        do {
          do {
            root.ptr = puVar54[-1];
            if (root.ptr == 0xfffffffffffffff8) goto LAB_00605985;
            puVar54 = puVar54 + -1;
            pauVar52 = pauVar52 + -1;
            local_5cc0 = *pauVar52;
            auVar81 = ZEXT3264(local_5cc0);
            auVar73 = vcmpps_avx(local_5cc0,local_5840,1);
          } while ((((((((auVar73 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                        (auVar73 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       (auVar73 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                      SUB321(auVar73 >> 0x7f,0) == '\0') &&
                     (auVar73 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    SUB321(auVar73 >> 0xbf,0) == '\0') &&
                   (auVar73 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                   -1 < auVar73[0x1f]);
          uVar48 = vmovmskps_avx(auVar73);
          pRVar49 = (RayK<8> *)CONCAT44((int)((ulong)pRVar49 >> 0x20),uVar48);
          local_5ce0 = POPCOUNT(uVar48);
          if (uVar55 < local_5ce0) {
LAB_00605026:
            do {
              if ((root.ptr & 8) != 0) {
                if (root.ptr == 0xfffffffffffffff8) goto LAB_00605985;
                local_5b20 = local_5840;
                auVar73 = vcmpps_avx(local_5840,auVar81._0_32_,6);
                if ((((((((auVar73 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar73 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar73 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar73 >> 0x7f,0) == '\0') &&
                      (auVar73 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar73 >> 0xbf,0) == '\0') &&
                    (auVar73 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar73[0x1f]) goto LAB_00604fe9;
                uVar47 = (ulong)((uint)root.ptr & 0xf);
                auVar59 = local_5d00;
                if (uVar47 == 8) goto LAB_0060583f;
                auVar70._0_4_ = auVar110._0_4_ ^ local_5d00._0_4_;
                auVar70._4_4_ = auVar110._4_4_ ^ local_5d00._4_4_;
                auVar70._8_4_ = auVar110._8_4_ ^ local_5d00._8_4_;
                auVar70._12_4_ = auVar110._12_4_ ^ local_5d00._12_4_;
                auVar70._16_4_ = auVar110._16_4_ ^ local_5d00._16_4_;
                auVar70._20_4_ = auVar110._20_4_ ^ local_5d00._20_4_;
                auVar70._24_4_ = auVar110._24_4_ ^ local_5d00._24_4_;
                auVar70._28_4_ = auVar110._28_4_ ^ local_5d00._28_4_;
                uStack_5c98 = *(undefined8 *)(ray + 8);
                uStack_5c90 = *(undefined8 *)(ray + 0x10);
                uStack_5c88 = *(undefined8 *)(ray + 0x18);
                uStack_5cd8 = *(undefined8 *)(ray + 0x48);
                uStack_5cd0 = *(undefined8 *)(ray + 0x50);
                uStack_5cc8 = *(undefined8 *)(ray + 0x58);
                uVar28 = *(undefined8 *)(ray + 0x60);
                uVar29 = *(undefined8 *)(ray + 0x68);
                uVar30 = *(undefined8 *)(ray + 0x70);
                uStack_5ba8 = *(undefined8 *)(ray + 0x78);
                pRVar1 = ray + 0xa0;
                local_5b60 = *(undefined8 *)pRVar1;
                uStack_5b58 = *(undefined8 *)(ray + 0xa8);
                uStack_5b50 = *(undefined8 *)(ray + 0xb0);
                auVar43 = *(undefined1 (*) [24])pRVar1;
                auVar42 = *(undefined1 (*) [24])pRVar1;
                uStack_5b48 = *(undefined8 *)(ray + 0xb8);
                pRVar2 = ray + 0xc0;
                local_5b80 = *(undefined8 *)pRVar2;
                uStack_5b78 = *(undefined8 *)(ray + 200);
                uStack_5b70 = *(undefined8 *)(ray + 0xd0);
                auVar44 = *(undefined1 (*) [24])pRVar2;
                auVar40 = *(undefined1 (*) [24])pRVar2;
                uStack_5b68 = *(undefined8 *)(ray + 0xd8);
                pRVar3 = ray + 0x80;
                local_5ba0 = *(undefined8 *)pRVar3;
                uStack_5b98 = *(undefined8 *)(ray + 0x88);
                uStack_5b90 = *(undefined8 *)(ray + 0x90);
                auVar45 = *(undefined1 (*) [24])pRVar3;
                auVar41 = *(undefined1 (*) [24])pRVar3;
                uStack_5b88 = *(undefined8 *)(ray + 0x98);
                uVar31 = *(undefined8 *)(ray + 0x100);
                uVar32 = *(undefined8 *)(ray + 0x108);
                uVar33 = *(undefined8 *)(ray + 0x110);
                uStack_5bc8 = *(undefined8 *)(ray + 0x118);
                pRVar4 = ray + 0x120;
                local_5c00 = *(undefined8 *)pRVar4;
                uStack_5bf8 = *(undefined8 *)(ray + 0x128);
                uStack_5bf0 = *(undefined8 *)(ray + 0x130);
                uStack_5be8 = *(undefined8 *)(ray + 0x138);
                lVar50 = (root.ptr & 0xfffffffffffffff0) + 0xc0;
                pRVar49 = (RayK<8> *)0x0;
                local_5d60 = local_5d00;
                goto LAB_006052aa;
              }
              pRVar49 = (RayK<8> *)(root.ptr & 0xfffffffffffffff0);
              lVar50 = 0;
              uVar47 = 8;
              auVar73 = auVar109._0_32_;
              do {
                uVar51 = *(ulong *)(pRVar49 + lVar50 * 8);
                if (uVar51 == 8) {
                  auVar81 = ZEXT3264(auVar73);
                  break;
                }
                uVar48 = *(undefined4 *)(root.ptr + 0x40 + lVar50 * 4);
                auVar69._4_4_ = uVar48;
                auVar69._0_4_ = uVar48;
                auVar69._8_4_ = uVar48;
                auVar69._12_4_ = uVar48;
                auVar69._16_4_ = uVar48;
                auVar69._20_4_ = uVar48;
                auVar69._24_4_ = uVar48;
                auVar69._28_4_ = uVar48;
                auVar37._4_4_ = fStack_591c;
                auVar37._0_4_ = local_5920;
                auVar37._8_4_ = fStack_5918;
                auVar37._12_4_ = fStack_5914;
                auVar37._16_4_ = fStack_5910;
                auVar37._20_4_ = fStack_590c;
                auVar37._24_4_ = fStack_5908;
                auVar37._28_4_ = uStack_5904;
                uVar48 = *(undefined4 *)(root.ptr + 0x80 + lVar50 * 4);
                auVar94._4_4_ = uVar48;
                auVar94._0_4_ = uVar48;
                auVar94._8_4_ = uVar48;
                auVar94._12_4_ = uVar48;
                auVar94._16_4_ = uVar48;
                auVar94._20_4_ = uVar48;
                auVar94._24_4_ = uVar48;
                auVar94._28_4_ = uVar48;
                auVar60 = vfmsub213ps_fma(auVar69,local_5980,auVar37);
                auVar38._4_4_ = fStack_58fc;
                auVar38._0_4_ = local_5900;
                auVar38._8_4_ = fStack_58f8;
                auVar38._12_4_ = fStack_58f4;
                auVar38._16_4_ = fStack_58f0;
                auVar38._20_4_ = fStack_58ec;
                auVar38._24_4_ = fStack_58e8;
                auVar38._28_4_ = uStack_58e4;
                uVar48 = *(undefined4 *)(root.ptr + 0xc0 + lVar50 * 4);
                auVar99._4_4_ = uVar48;
                auVar99._0_4_ = uVar48;
                auVar99._8_4_ = uVar48;
                auVar99._12_4_ = uVar48;
                auVar99._16_4_ = uVar48;
                auVar99._20_4_ = uVar48;
                auVar99._24_4_ = uVar48;
                auVar99._28_4_ = uVar48;
                auVar7 = vfmsub213ps_fma(auVar94,local_5960,auVar38);
                auVar39._4_4_ = fStack_58dc;
                auVar39._0_4_ = local_58e0;
                auVar39._8_4_ = fStack_58d8;
                auVar39._12_4_ = fStack_58d4;
                auVar39._16_4_ = fStack_58d0;
                auVar39._20_4_ = fStack_58cc;
                auVar39._24_4_ = fStack_58c8;
                auVar39._28_4_ = uStack_58c4;
                uVar48 = *(undefined4 *)(root.ptr + 0x60 + lVar50 * 4);
                auVar106._4_4_ = uVar48;
                auVar106._0_4_ = uVar48;
                auVar106._8_4_ = uVar48;
                auVar106._12_4_ = uVar48;
                auVar106._16_4_ = uVar48;
                auVar106._20_4_ = uVar48;
                auVar106._24_4_ = uVar48;
                auVar106._28_4_ = uVar48;
                auVar15 = vfmsub213ps_fma(auVar99,local_5940,auVar39);
                auVar16 = vfmsub213ps_fma(auVar106,local_5980,auVar37);
                uVar48 = *(undefined4 *)(root.ptr + 0xa0 + lVar50 * 4);
                auVar90._4_4_ = uVar48;
                auVar90._0_4_ = uVar48;
                auVar90._8_4_ = uVar48;
                auVar90._12_4_ = uVar48;
                auVar90._16_4_ = uVar48;
                auVar90._20_4_ = uVar48;
                auVar90._24_4_ = uVar48;
                auVar90._28_4_ = uVar48;
                auVar17 = vfmsub213ps_fma(auVar90,local_5960,auVar38);
                uVar48 = *(undefined4 *)(root.ptr + 0xe0 + lVar50 * 4);
                auVar76._4_4_ = uVar48;
                auVar76._0_4_ = uVar48;
                auVar76._8_4_ = uVar48;
                auVar76._12_4_ = uVar48;
                auVar76._16_4_ = uVar48;
                auVar76._20_4_ = uVar48;
                auVar76._24_4_ = uVar48;
                auVar76._28_4_ = uVar48;
                auVar12 = vfmsub213ps_fma(auVar76,local_5940,auVar39);
                auVar61 = vpminsd_avx2(ZEXT1632(auVar60),ZEXT1632(auVar16));
                auVar82 = vpminsd_avx2(ZEXT1632(auVar7),ZEXT1632(auVar17));
                auVar61 = vpmaxsd_avx2(auVar61,auVar82);
                auVar82 = vpminsd_avx2(ZEXT1632(auVar15),ZEXT1632(auVar12));
                auVar82 = vpmaxsd_avx2(auVar61,auVar82);
                auVar61 = vpmaxsd_avx2(ZEXT1632(auVar60),ZEXT1632(auVar16));
                auVar83 = vpmaxsd_avx2(ZEXT1632(auVar7),ZEXT1632(auVar17));
                auVar83 = vpminsd_avx2(auVar61,auVar83);
                auVar61 = vpmaxsd_avx2(ZEXT1632(auVar15),ZEXT1632(auVar12));
                auVar83 = vpminsd_avx2(auVar83,auVar61);
                auVar61 = vpmaxsd_avx2(auVar82,local_5860);
                auVar83 = vpminsd_avx2(auVar83,local_5840);
                auVar61 = vcmpps_avx(auVar61,auVar83,2);
                if ((((((((auVar61 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                         (auVar61 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                        (auVar61 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                       SUB321(auVar61 >> 0x7f,0) == '\0') &&
                      (auVar61 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                     SUB321(auVar61 >> 0xbf,0) == '\0') &&
                    (auVar61 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                    -1 < auVar61[0x1f]) {
                  auVar81 = ZEXT3264(auVar73);
                  uVar51 = uVar47;
                }
                else {
                  auVar61 = vblendvps_avx(auVar109._0_32_,auVar82,auVar61);
                  auVar81 = ZEXT3264(auVar61);
                  if (uVar47 != 8) {
                    *puVar54 = uVar47;
                    puVar54 = puVar54 + 1;
                    *pauVar52 = auVar73;
                    pauVar52 = pauVar52 + 1;
                  }
                }
                uVar47 = uVar51;
                lVar50 = lVar50 + 1;
                auVar73 = auVar81._0_32_;
              } while (lVar50 != 8);
              if (uVar47 == 8) goto LAB_006051a4;
              auVar73 = vcmpps_avx(local_5840,auVar81._0_32_,6);
              uVar48 = vmovmskps_avx(auVar73);
              root.ptr = uVar47;
            } while ((byte)uVar55 < (byte)POPCOUNT(uVar48));
            *puVar54 = uVar47;
            puVar54 = puVar54 + 1;
            *pauVar52 = auVar81._0_32_;
            pauVar52 = pauVar52 + 1;
LAB_006051a4:
            iVar46 = 4;
            pRVar1 = pRVar49;
          }
          else {
            uStack_5cdc = 0;
            while (pRVar49 != (RayK<8> *)0x0) {
              local_5d80._0_8_ = pRVar49;
              local_5ca0 = 0;
              for (; ((ulong)pRVar49 & 1) == 0;
                  pRVar49 = (RayK<8> *)((ulong)pRVar49 >> 1 | 0x8000000000000000)) {
                local_5ca0 = local_5ca0 + 1;
              }
              auVar73 = ZEXT1632(auVar110._0_16_);
              in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
              in_ZMM15 = ZEXT1664(in_ZMM15._0_16_);
              local_5d88 = This;
              local_5d18 = ray;
              local_5d10 = context;
              bVar56 = occluded1(This,local_5d90,root,local_5ca0,&local_5d91,ray,
                                 (TravRayK<8,_false> *)&local_5a40.field_0,context);
              if (bVar56) {
                *(undefined4 *)(local_5d00 + local_5ca0 * 4) = 0xffffffff;
              }
              pRVar49 = (RayK<8> *)(local_5d80._0_8_ - 1 & local_5d80._0_8_);
              auVar109 = ZEXT3264(CONCAT428(0x7f800000,
                                            CONCAT424(0x7f800000,
                                                      CONCAT420(0x7f800000,
                                                                CONCAT416(0x7f800000,
                                                                          CONCAT412(0x7f800000,
                                                                                    CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
              auVar73 = vpcmpeqd_avx2(auVar73,auVar73);
              auVar110 = ZEXT3264(auVar73);
              auVar81 = ZEXT3264(local_5cc0);
              This = local_5d88;
              ray = local_5d18;
              context = local_5d10;
            }
            auVar73 = auVar110._0_32_ & ~local_5d00;
            iVar46 = 3;
            if ((((((((auVar73 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar73 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar73 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar73 >> 0x7f,0) != '\0') ||
                  (auVar73 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar73 >> 0xbf,0) != '\0') ||
                (auVar73 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar73[0x1f] < '\0') {
              auVar73._8_4_ = 0xff800000;
              auVar73._0_8_ = 0xff800000ff800000;
              auVar73._12_4_ = 0xff800000;
              auVar73._16_4_ = 0xff800000;
              auVar73._20_4_ = 0xff800000;
              auVar73._24_4_ = 0xff800000;
              auVar73._28_4_ = 0xff800000;
              local_5840 = vblendvps_avx(local_5840,auVar73,local_5d00);
              iVar46 = 2;
            }
            pRVar49 = (RayK<8> *)0x0;
            pRVar1 = (RayK<8> *)0x0;
            if (uVar55 < local_5ce0) goto LAB_00605026;
          }
          pRVar49 = pRVar1;
        } while (iVar46 != 3);
LAB_00605985:
        auVar73 = vandps_avx(local_5b40,local_5d00);
        auVar66._8_4_ = 0xff800000;
        auVar66._0_8_ = 0xff800000ff800000;
        auVar66._12_4_ = 0xff800000;
        auVar66._16_4_ = 0xff800000;
        auVar66._20_4_ = 0xff800000;
        auVar66._24_4_ = 0xff800000;
        auVar66._28_4_ = 0xff800000;
        auVar73 = vmaskmovps_avx(auVar73,auVar66);
        *(undefined1 (*) [32])local_5d08 = auVar73;
      }
    }
    else {
      occludedCoherent(valid_i,This,ray,context);
    }
  }
  return;
  while( true ) {
    pRVar49 = pRVar49 + 1;
    lVar50 = lVar50 + 0xe0;
    if ((RayK<8> *)(uVar47 - 8) <= pRVar49) break;
LAB_006052aa:
    local_5d40 = auVar70;
    uVar51 = 0;
    local_5d80 = local_5d40;
    while (uVar53 = (ulong)*(uint *)(lVar50 + uVar51 * 4), uVar53 != 0xffffffff) {
      fVar5 = *(float *)(lVar50 + -0xc0 + uVar51 * 4);
      auVar85._4_4_ = fVar5;
      auVar85._0_4_ = fVar5;
      auVar85._8_4_ = fVar5;
      auVar85._12_4_ = fVar5;
      auVar85._16_4_ = fVar5;
      auVar85._20_4_ = fVar5;
      auVar85._24_4_ = fVar5;
      auVar85._28_4_ = fVar5;
      fVar98 = *(float *)(lVar50 + -0xb0 + uVar51 * 4);
      auVar95._4_4_ = fVar98;
      auVar95._0_4_ = fVar98;
      auVar95._8_4_ = fVar98;
      auVar95._12_4_ = fVar98;
      auVar95._16_4_ = fVar98;
      auVar95._20_4_ = fVar98;
      auVar95._24_4_ = fVar98;
      auVar95._28_4_ = fVar98;
      fVar6 = *(float *)(lVar50 + -0xa0 + uVar51 * 4);
      auVar96._4_4_ = fVar6;
      auVar96._0_4_ = fVar6;
      auVar96._8_4_ = fVar6;
      auVar96._12_4_ = fVar6;
      auVar96._16_4_ = fVar6;
      auVar96._20_4_ = fVar6;
      auVar96._24_4_ = fVar6;
      auVar96._28_4_ = fVar6;
      local_5c40._4_4_ = *(float *)(lVar50 + -0x90 + uVar51 * 4);
      local_5c60._4_4_ = *(float *)(lVar50 + -0x80 + uVar51 * 4);
      local_5c80._4_4_ = *(float *)(lVar50 + -0x70 + uVar51 * 4);
      local_5a60 = *(float *)(lVar50 + -0x20 + uVar51 * 4);
      local_5a80 = *(float *)(lVar50 + -0x10 + uVar51 * 4);
      local_5c40._0_4_ = local_5c40._4_4_;
      fStack_5c38 = (float)local_5c40._4_4_;
      fStack_5c34 = (float)local_5c40._4_4_;
      fStack_5c30 = (float)local_5c40._4_4_;
      fStack_5c2c = (float)local_5c40._4_4_;
      fStack_5c28 = (float)local_5c40._4_4_;
      fStack_5c24 = (float)local_5c40._4_4_;
      fVar8 = fVar5 - (float)local_5c40._4_4_;
      local_5ae0._4_4_ = fVar8;
      local_5ae0._0_4_ = fVar8;
      local_5ae0._8_4_ = fVar8;
      local_5ae0._12_4_ = fVar8;
      local_5ae0._16_4_ = fVar8;
      local_5ae0._20_4_ = fVar8;
      local_5ae0._24_4_ = fVar8;
      local_5ae0._28_4_ = fVar8;
      local_5c60._0_4_ = local_5c60._4_4_;
      fStack_5c58 = (float)local_5c60._4_4_;
      fStack_5c54 = (float)local_5c60._4_4_;
      fStack_5c50 = (float)local_5c60._4_4_;
      fStack_5c4c = (float)local_5c60._4_4_;
      fStack_5c48 = (float)local_5c60._4_4_;
      fStack_5c44 = (float)local_5c60._4_4_;
      fVar9 = fVar98 - (float)local_5c60._4_4_;
      local_5c80._0_4_ = local_5c80._4_4_;
      fStack_5c78 = (float)local_5c80._4_4_;
      fStack_5c74 = (float)local_5c80._4_4_;
      fStack_5c70 = (float)local_5c80._4_4_;
      fStack_5c6c = (float)local_5c80._4_4_;
      fStack_5c68 = (float)local_5c80._4_4_;
      fStack_5c64 = (float)local_5c80._4_4_;
      fVar10 = fVar6 - (float)local_5c80._4_4_;
      local_5b00._4_4_ = fVar10;
      local_5b00._0_4_ = fVar10;
      local_5b00._8_4_ = fVar10;
      local_5b00._12_4_ = fVar10;
      local_5b00._16_4_ = fVar10;
      local_5b00._20_4_ = fVar10;
      local_5b00._24_4_ = fVar10;
      local_5b00._28_4_ = fVar10;
      fVar98 = local_5a60 - fVar98;
      auVar100._4_4_ = fVar98;
      auVar100._0_4_ = fVar98;
      auVar100._8_4_ = fVar98;
      auVar100._12_4_ = fVar98;
      auVar100._16_4_ = fVar98;
      auVar100._20_4_ = fVar98;
      auVar100._24_4_ = fVar98;
      auVar100._28_4_ = fVar98;
      fVar6 = local_5a80 - fVar6;
      fVar8 = fVar8 * fVar98;
      auVar62._4_4_ = fVar6;
      auVar62._0_4_ = fVar6;
      auVar62._8_4_ = fVar6;
      auVar62._12_4_ = fVar6;
      auVar62._16_4_ = fVar6;
      auVar62._20_4_ = fVar6;
      auVar62._24_4_ = fVar6;
      auVar62._28_4_ = fVar6;
      fVar98 = fVar6 * fVar9;
      auVar108._4_4_ = fVar98;
      auVar108._0_4_ = fVar98;
      auVar108._8_4_ = fVar98;
      auVar108._12_4_ = fVar98;
      auVar108._16_4_ = fVar98;
      auVar108._20_4_ = fVar98;
      auVar108._24_4_ = fVar98;
      auVar108._28_4_ = fVar98;
      auVar15 = vfmsub231ps_fma(auVar108,auVar100,local_5b00);
      local_5aa0 = *(float *)(lVar50 + -0x30 + uVar51 * 4);
      fVar5 = local_5aa0 - fVar5;
      fVar98 = fVar5 * fVar10;
      auVar77._4_4_ = fVar98;
      auVar77._0_4_ = fVar98;
      auVar77._8_4_ = fVar98;
      auVar77._12_4_ = fVar98;
      auVar77._16_4_ = fVar98;
      auVar77._20_4_ = fVar98;
      auVar77._24_4_ = fVar98;
      auVar77._28_4_ = fVar98;
      auVar16 = vfmsub231ps_fma(auVar77,auVar62,local_5ae0);
      auVar61 = vsubps_avx(auVar85,*(undefined1 (*) [32])ray);
      auVar82 = vsubps_avx(auVar95,*(undefined1 (*) [32])(ray + 0x20));
      auVar110 = ZEXT3264(auVar82);
      auVar83 = vsubps_avx(auVar96,*(undefined1 (*) [32])(ray + 0x40));
      auVar109._0_4_ = auVar40._0_4_ * auVar61._0_4_;
      auVar109._4_4_ = auVar40._4_4_ * auVar61._4_4_;
      auVar109._8_4_ = auVar40._8_4_ * auVar61._8_4_;
      auVar109._12_4_ = auVar40._12_4_ * auVar61._12_4_;
      auVar109._16_4_ = auVar40._16_4_ * auVar61._16_4_;
      auVar109._20_4_ = auVar40._20_4_ * auVar61._20_4_;
      fVar98 = (float)uStack_5b68;
      auVar109._28_36_ = in_ZMM13._28_36_;
      auVar109._24_4_ = fVar98 * auVar61._24_4_;
      auVar17 = vfmsub231ps_fma(auVar109._0_32_,auVar83,*(undefined1 (*) [32])pRVar3);
      in_ZMM13 = ZEXT1664(auVar17);
      auVar81._0_4_ = auVar82._0_4_ * auVar41._0_4_;
      auVar81._4_4_ = auVar82._4_4_ * auVar41._4_4_;
      auVar81._8_4_ = auVar82._8_4_ * auVar41._8_4_;
      auVar81._12_4_ = auVar82._12_4_ * auVar41._12_4_;
      auVar81._16_4_ = auVar82._16_4_ * auVar41._16_4_;
      auVar81._20_4_ = auVar82._20_4_ * auVar41._20_4_;
      auVar81._28_36_ = in_ZMM15._28_36_;
      auVar81._24_4_ = auVar82._24_4_ * (float)uStack_5b88;
      auVar12 = vfmsub231ps_fma(auVar81._0_32_,auVar61,*(undefined1 (*) [32])pRVar1);
      in_ZMM15 = ZEXT1664(auVar12);
      auVar18._4_4_ = auVar12._4_4_ * fVar6;
      auVar18._0_4_ = auVar12._0_4_ * fVar6;
      auVar18._8_4_ = auVar12._8_4_ * fVar6;
      auVar18._12_4_ = auVar12._12_4_ * fVar6;
      auVar18._16_4_ = fVar6 * 0.0;
      auVar18._20_4_ = fVar6 * 0.0;
      auVar18._24_4_ = fVar6 * 0.0;
      auVar18._28_4_ = fVar6;
      auVar60 = vfmadd231ps_fma(auVar18,ZEXT1632(auVar17),auVar100);
      auVar91._4_4_ = fVar9;
      auVar91._0_4_ = fVar9;
      auVar91._8_4_ = fVar9;
      auVar91._12_4_ = fVar9;
      auVar91._16_4_ = fVar9;
      auVar91._20_4_ = fVar9;
      auVar91._24_4_ = fVar9;
      auVar91._28_4_ = fVar9;
      auVar57._4_4_ = fVar5;
      auVar57._0_4_ = fVar5;
      auVar57._8_4_ = fVar5;
      auVar57._12_4_ = fVar5;
      auVar57._16_4_ = fVar5;
      auVar57._20_4_ = fVar5;
      auVar57._24_4_ = fVar5;
      auVar57._28_4_ = fVar5;
      auVar101._4_4_ = fVar8;
      auVar101._0_4_ = fVar8;
      auVar101._8_4_ = fVar8;
      auVar101._12_4_ = fVar8;
      auVar101._16_4_ = fVar8;
      auVar101._20_4_ = fVar8;
      auVar101._24_4_ = fVar8;
      auVar101._28_4_ = fVar8;
      auVar13 = vfmsub231ps_fma(auVar101,auVar57,auVar91);
      auVar103._0_4_ = auVar42._0_4_ * auVar83._0_4_;
      auVar103._4_4_ = auVar42._4_4_ * auVar83._4_4_;
      auVar103._8_4_ = auVar42._8_4_ * auVar83._8_4_;
      auVar103._12_4_ = auVar42._12_4_ * auVar83._12_4_;
      auVar103._16_4_ = auVar42._16_4_ * auVar83._16_4_;
      auVar103._20_4_ = auVar42._20_4_ * auVar83._20_4_;
      auVar103._24_4_ = (float)uStack_5b48 * auVar83._24_4_;
      auVar103._28_4_ = 0;
      auVar14 = vfmsub231ps_fma(auVar103,auVar82,*(undefined1 (*) [32])pRVar2);
      auVar60 = vfmadd231ps_fma(ZEXT1632(auVar60),ZEXT1632(auVar14),auVar57);
      auVar19._4_4_ = auVar13._4_4_ * auVar40._4_4_;
      auVar19._0_4_ = auVar13._0_4_ * auVar40._0_4_;
      auVar19._8_4_ = auVar13._8_4_ * auVar40._8_4_;
      auVar19._12_4_ = auVar13._12_4_ * auVar40._12_4_;
      auVar19._16_4_ = auVar40._16_4_ * 0.0;
      auVar19._20_4_ = auVar40._20_4_ * 0.0;
      auVar19._24_4_ = fVar98 * 0.0;
      auVar19._28_4_ = (int)((ulong)uStack_5b68 >> 0x20);
      auVar7 = vfmadd231ps_fma(auVar19,ZEXT1632(auVar16),*(undefined1 (*) [32])pRVar1);
      auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),ZEXT1632(auVar15),*(undefined1 (*) [32])pRVar3);
      local_5ac0._8_4_ = 0x80000000;
      local_5ac0._0_8_ = 0x8000000080000000;
      local_5ac0._12_4_ = 0x80000000;
      local_5ac0._16_4_ = 0x80000000;
      local_5ac0._20_4_ = 0x80000000;
      local_5ac0._24_4_ = 0x80000000;
      local_5ac0._28_4_ = 0x80000000;
      auVar73 = vandps_avx(ZEXT1632(auVar7),local_5ac0);
      uVar113 = auVar73._0_4_;
      auVar63._0_4_ = uVar113 ^ auVar60._0_4_;
      uVar114 = auVar73._4_4_;
      auVar63._4_4_ = uVar114 ^ auVar60._4_4_;
      uVar115 = auVar73._8_4_;
      auVar63._8_4_ = uVar115 ^ auVar60._8_4_;
      uVar116 = auVar73._12_4_;
      auVar63._12_4_ = uVar116 ^ auVar60._12_4_;
      uVar48 = auVar73._16_4_;
      auVar63._16_4_ = uVar48;
      uVar117 = auVar73._20_4_;
      auVar63._20_4_ = uVar117;
      uVar118 = auVar73._24_4_;
      auVar63._24_4_ = uVar118;
      uVar119 = auVar73._28_4_;
      auVar63._28_4_ = uVar119;
      auVar73 = vcmpps_avx(auVar63,_DAT_01faff00,5);
      auVar84 = local_5d80 & auVar73;
      local_5bc0._0_4_ = (float)uVar28;
      local_5bc0._4_4_ = (float)((ulong)uVar28 >> 0x20);
      uStack_5bb8._0_4_ = (float)uVar29;
      uStack_5bb8._4_4_ = (float)((ulong)uVar29 >> 0x20);
      uStack_5bb0._0_4_ = (float)uVar30;
      uStack_5bb0._4_4_ = (float)((ulong)uVar30 >> 0x20);
      local_5be0._0_4_ = (float)uVar31;
      local_5be0._4_4_ = (float)((ulong)uVar31 >> 0x20);
      uStack_5bd8._0_4_ = (float)uVar32;
      uStack_5bd8._4_4_ = (float)((ulong)uVar32 >> 0x20);
      uStack_5bd0._0_4_ = (float)uVar33;
      uStack_5bd0._4_4_ = (float)((ulong)uVar33 >> 0x20);
      auVar68 = ZEXT436(uVar119);
      auVar75 = ZEXT436(0x80000000);
      if ((((((((auVar84 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar84 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar84 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar84 >> 0x7f,0) != '\0') ||
            (auVar84 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar84 >> 0xbf,0) != '\0') ||
          (auVar84 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar84[0x1f] < '\0') {
        auVar73 = vandps_avx(auVar73,local_5d80);
        auVar24._4_4_ = auVar12._4_4_ * fVar10;
        auVar24._0_4_ = auVar12._0_4_ * fVar10;
        auVar24._8_4_ = auVar12._8_4_ * fVar10;
        auVar24._12_4_ = auVar12._12_4_ * fVar10;
        auVar24._16_4_ = fVar10 * 0.0;
        auVar24._20_4_ = fVar10 * 0.0;
        auVar24._24_4_ = fVar10 * 0.0;
        auVar24._28_4_ = 0x80000000;
        auVar75 = ZEXT436(0x80000000);
        auVar60 = vfmadd213ps_fma(auVar91,ZEXT1632(auVar17),auVar24);
        auVar60 = vfmadd213ps_fma(local_5ae0,ZEXT1632(auVar14),ZEXT1632(auVar60));
        auVar93._0_4_ = uVar113 ^ auVar60._0_4_;
        auVar93._4_4_ = uVar114 ^ auVar60._4_4_;
        auVar93._8_4_ = uVar115 ^ auVar60._8_4_;
        auVar93._12_4_ = uVar116 ^ auVar60._12_4_;
        auVar93._16_4_ = uVar48;
        auVar93._20_4_ = uVar117;
        auVar93._24_4_ = uVar118;
        auVar93._28_4_ = uVar119;
        auVar84 = vcmpps_avx(auVar93,_DAT_01faff00,5);
        auVar88 = auVar73 & auVar84;
        auVar68 = ZEXT436(uVar119);
        if ((((((((auVar88 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar88 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar88 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar88 >> 0x7f,0) != '\0') ||
              (auVar88 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar88 >> 0xbf,0) != '\0') ||
            (auVar88 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar88[0x1f] < '\0') {
          auVar88 = vandps_avx(ZEXT1632(auVar7),local_5c20);
          auVar75 = ZEXT436(auVar88._28_4_);
          auVar73 = vandps_avx(auVar84,auVar73);
          auVar84 = vsubps_avx(auVar88,auVar63);
          auVar84 = vcmpps_avx(auVar84,auVar93,5);
          auVar68 = ZEXT436(auVar84._28_4_);
          auVar89 = auVar73 & auVar84;
          if ((((((((auVar89 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar89 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar89 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar89 >> 0x7f,0) != '\0') ||
                (auVar89 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar89 >> 0xbf,0) != '\0') ||
              (auVar89 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar89[0x1f] < '\0') {
            auVar73 = vandps_avx(auVar73,auVar84);
            auVar68 = ZEXT436(auVar73._28_4_);
            auVar26._4_4_ = auVar13._4_4_ * auVar83._4_4_;
            auVar26._0_4_ = auVar13._0_4_ * auVar83._0_4_;
            auVar26._8_4_ = auVar13._8_4_ * auVar83._8_4_;
            auVar26._12_4_ = auVar13._12_4_ * auVar83._12_4_;
            auVar26._16_4_ = auVar83._16_4_ * 0.0;
            auVar26._20_4_ = auVar83._20_4_ * 0.0;
            auVar26._24_4_ = auVar83._24_4_ * 0.0;
            auVar26._28_4_ = uVar119;
            auVar60 = vfmadd213ps_fma(auVar82,ZEXT1632(auVar16),auVar26);
            auVar110 = ZEXT1664(auVar60);
            auVar60 = vfmadd213ps_fma(auVar61,ZEXT1632(auVar15),ZEXT1632(auVar60));
            auVar79._0_4_ = uVar113 ^ auVar60._0_4_;
            auVar79._4_4_ = uVar114 ^ auVar60._4_4_;
            auVar79._8_4_ = uVar115 ^ auVar60._8_4_;
            auVar79._12_4_ = uVar116 ^ auVar60._12_4_;
            auVar79._16_4_ = uVar48;
            auVar79._20_4_ = uVar117;
            auVar79._24_4_ = uVar118;
            auVar79._28_4_ = uVar119;
            auVar87._0_4_ = auVar88._0_4_ * (float)local_5bc0;
            auVar87._4_4_ = auVar88._4_4_ * local_5bc0._4_4_;
            auVar87._8_4_ = auVar88._8_4_ * (float)uStack_5bb8;
            auVar87._12_4_ = auVar88._12_4_ * uStack_5bb8._4_4_;
            auVar87._16_4_ = auVar88._16_4_ * (float)uStack_5bb0;
            auVar87._20_4_ = auVar88._20_4_ * uStack_5bb0._4_4_;
            auVar87._24_4_ = auVar88._24_4_ * (float)uStack_5ba8;
            auVar87._28_4_ = 0;
            auVar61 = vcmpps_avx(auVar87,auVar79,1);
            auVar27._4_4_ = auVar88._4_4_ * local_5be0._4_4_;
            auVar27._0_4_ = auVar88._0_4_ * (float)local_5be0;
            auVar27._8_4_ = auVar88._8_4_ * (float)uStack_5bd8;
            auVar27._12_4_ = auVar88._12_4_ * uStack_5bd8._4_4_;
            auVar27._16_4_ = auVar88._16_4_ * (float)uStack_5bd0;
            auVar27._20_4_ = auVar88._20_4_ * uStack_5bd0._4_4_;
            auVar27._24_4_ = auVar88._24_4_ * (float)uStack_5bc8;
            auVar27._28_4_ = auVar88._28_4_;
            auVar82 = vcmpps_avx(auVar79,auVar27,2);
            auVar61 = vandps_avx(auVar82,auVar61);
            auVar75 = ZEXT436(auVar61._28_4_);
            auVar82 = auVar73 & auVar61;
            if ((((((((auVar82 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar82 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar82 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar82 >> 0x7f,0) != '\0') ||
                  (auVar82 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar82 >> 0xbf,0) != '\0') ||
                (auVar82 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar82[0x1f] < '\0') {
              auVar73 = vandps_avx(auVar61,auVar73);
              auVar68 = ZEXT436(auVar73._28_4_);
              auVar61 = vcmpps_avx(ZEXT1632(auVar7),_DAT_01faff00,4);
              auVar75 = ZEXT436(auVar61._28_4_);
              auVar82 = auVar73 & auVar61;
              if ((((((((auVar82 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar82 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar82 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar82 >> 0x7f,0) != '\0') ||
                    (auVar82 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar82 >> 0xbf,0) != '\0') ||
                  (auVar82 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar82[0x1f] < '\0') {
                uVar113 = ((context->scene->geometries).items[uVar53].ptr)->mask;
                auVar80._4_4_ = uVar113;
                auVar80._0_4_ = uVar113;
                auVar80._8_4_ = uVar113;
                auVar80._12_4_ = uVar113;
                auVar80._16_4_ = uVar113;
                auVar80._20_4_ = uVar113;
                auVar80._24_4_ = uVar113;
                auVar80._28_4_ = uVar113;
                auVar73 = vandps_avx(auVar61,auVar73);
                auVar68 = ZEXT436(auVar73._28_4_);
                auVar61 = vpand_avx2(auVar80,*(undefined1 (*) [32])pRVar4);
                auVar82 = vpcmpeqd_avx2(auVar61,_DAT_01faff00);
                auVar75 = ZEXT436(auVar82._28_4_);
                auVar61 = auVar73 & ~auVar82;
                if ((((((((auVar61 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar61 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar61 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar61 >> 0x7f,0) != '\0') ||
                      (auVar61 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar61 >> 0xbf,0) != '\0') ||
                    (auVar61 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar61[0x1f] < '\0') {
                  auVar73 = vandnps_avx(auVar82,auVar73);
                  local_5d80 = vandnps_avx(auVar73,local_5d80);
                  auVar68 = ZEXT436(auVar73._28_4_);
                  auVar75 = ZEXT436(auVar82._28_4_);
                }
              }
            }
          }
        }
      }
      fStack_5a9c = local_5aa0;
      fStack_5a98 = local_5aa0;
      fStack_5a94 = local_5aa0;
      fStack_5a90 = local_5aa0;
      fStack_5a8c = local_5aa0;
      fStack_5a88 = local_5aa0;
      fStack_5a84 = local_5aa0;
      fStack_5a7c = local_5a80;
      fStack_5a78 = local_5a80;
      fStack_5a74 = local_5a80;
      fStack_5a70 = local_5a80;
      fStack_5a6c = local_5a80;
      fStack_5a68 = local_5a80;
      fStack_5a64 = local_5a80;
      fStack_5a5c = local_5a60;
      fStack_5a58 = local_5a60;
      fStack_5a54 = local_5a60;
      fStack_5a50 = local_5a60;
      fStack_5a4c = local_5a60;
      fStack_5a48 = local_5a60;
      fStack_5a44 = local_5a60;
      if ((((((((local_5d80 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (local_5d80 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (local_5d80 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(local_5d80 >> 0x7f,0) == '\0') &&
            (local_5d80 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(local_5d80 >> 0xbf,0) == '\0') &&
          (local_5d80 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < local_5d80[0x1f]) {
        auVar109 = ZEXT3264(CONCAT428(0x7f800000,
                                      CONCAT424(0x7f800000,
                                                CONCAT420(0x7f800000,
                                                          CONCAT416(0x7f800000,
                                                                    CONCAT412(0x7f800000,
                                                                              CONCAT48(0x7f800000,
                                                                                                                                                                              
                                                  0x7f8000007f800000)))))));
        auVar73 = vpcmpeqd_avx2(auVar110._0_32_,auVar110._0_32_);
        auVar110 = ZEXT3264(auVar73);
        break;
      }
      uVar48 = *(undefined4 *)(lVar50 + -0x60 + uVar51 * 4);
      auVar78._4_4_ = uVar48;
      auVar78._0_4_ = uVar48;
      auVar78._8_4_ = uVar48;
      auVar78._12_4_ = uVar48;
      auVar78._16_4_ = uVar48;
      auVar78._20_4_ = uVar48;
      auVar78._24_4_ = uVar48;
      auVar78._28_4_ = uVar48;
      uVar48 = *(undefined4 *)(lVar50 + -0x50 + uVar51 * 4);
      auVar92._4_4_ = uVar48;
      auVar92._0_4_ = uVar48;
      auVar92._8_4_ = uVar48;
      auVar92._12_4_ = uVar48;
      auVar92._16_4_ = uVar48;
      auVar92._20_4_ = uVar48;
      auVar92._24_4_ = uVar48;
      auVar92._28_4_ = uVar48;
      uVar48 = *(undefined4 *)(lVar50 + -0x40 + uVar51 * 4);
      auVar104._4_4_ = uVar48;
      auVar104._0_4_ = uVar48;
      auVar104._8_4_ = uVar48;
      auVar104._12_4_ = uVar48;
      auVar104._16_4_ = uVar48;
      auVar104._20_4_ = uVar48;
      auVar104._24_4_ = uVar48;
      auVar104._28_4_ = uVar48;
      auVar34._4_4_ = local_5aa0;
      auVar34._0_4_ = local_5aa0;
      auVar34._8_4_ = local_5aa0;
      auVar34._12_4_ = local_5aa0;
      auVar34._16_4_ = local_5aa0;
      auVar34._20_4_ = local_5aa0;
      auVar34._24_4_ = local_5aa0;
      auVar34._28_4_ = local_5aa0;
      auVar61 = vsubps_avx(auVar78,auVar34);
      auVar36._4_4_ = local_5a60;
      auVar36._0_4_ = local_5a60;
      auVar36._8_4_ = local_5a60;
      auVar36._12_4_ = local_5a60;
      auVar36._16_4_ = local_5a60;
      auVar36._20_4_ = local_5a60;
      auVar36._24_4_ = local_5a60;
      auVar36._28_4_ = local_5a60;
      auVar82 = vsubps_avx(auVar92,auVar36);
      auVar35._4_4_ = local_5a80;
      auVar35._0_4_ = local_5a80;
      auVar35._8_4_ = local_5a80;
      auVar35._12_4_ = local_5a80;
      auVar35._16_4_ = local_5a80;
      auVar35._20_4_ = local_5a80;
      auVar35._24_4_ = local_5a80;
      auVar35._28_4_ = local_5a80;
      auVar83 = vsubps_avx(auVar104,auVar35);
      auVar84 = vsubps_avx(_local_5c40,auVar78);
      auVar73 = vsubps_avx(_local_5c60,auVar92);
      auVar88 = vsubps_avx(_local_5c80,auVar104);
      auVar67._0_4_ = auVar88._0_4_ * auVar82._0_4_;
      auVar67._4_4_ = auVar88._4_4_ * auVar82._4_4_;
      auVar67._8_4_ = auVar88._8_4_ * auVar82._8_4_;
      auVar67._12_4_ = auVar88._12_4_ * auVar82._12_4_;
      auVar67._16_4_ = auVar88._16_4_ * auVar82._16_4_;
      auVar67._20_4_ = auVar88._20_4_ * auVar82._20_4_;
      auVar67._24_4_ = auVar88._24_4_ * auVar82._24_4_;
      auVar67._28_36_ = auVar68;
      auVar15 = vfmsub231ps_fma(auVar67._0_32_,auVar73,auVar83);
      auVar74._0_4_ = auVar83._0_4_ * auVar84._0_4_;
      auVar74._4_4_ = auVar83._4_4_ * auVar84._4_4_;
      auVar74._8_4_ = auVar83._8_4_ * auVar84._8_4_;
      auVar74._12_4_ = auVar83._12_4_ * auVar84._12_4_;
      auVar74._16_4_ = auVar83._16_4_ * auVar84._16_4_;
      auVar74._20_4_ = auVar83._20_4_ * auVar84._20_4_;
      auVar74._24_4_ = auVar83._24_4_ * auVar84._24_4_;
      auVar74._28_36_ = auVar75;
      auVar16 = vfmsub231ps_fma(auVar74._0_32_,auVar88,auVar61);
      auVar20._4_4_ = auVar73._4_4_ * auVar61._4_4_;
      auVar20._0_4_ = auVar73._0_4_ * auVar61._0_4_;
      auVar20._8_4_ = auVar73._8_4_ * auVar61._8_4_;
      auVar20._12_4_ = auVar73._12_4_ * auVar61._12_4_;
      auVar20._16_4_ = auVar73._16_4_ * auVar61._16_4_;
      auVar20._20_4_ = auVar73._20_4_ * auVar61._20_4_;
      auVar20._24_4_ = auVar73._24_4_ * auVar61._24_4_;
      auVar20._28_4_ = auVar61._28_4_;
      auVar17 = vfmsub231ps_fma(auVar20,auVar84,auVar82);
      auVar89 = vsubps_avx(auVar78,*(undefined1 (*) [32])ray);
      auVar105 = vsubps_avx(auVar92,*(undefined1 (*) [32])(ray + 0x20));
      auVar107 = vsubps_avx(auVar104,*(undefined1 (*) [32])(ray + 0x40));
      auVar111._0_4_ = auVar107._0_4_ * auVar43._0_4_;
      auVar111._4_4_ = auVar107._4_4_ * auVar43._4_4_;
      auVar111._8_4_ = auVar107._8_4_ * auVar43._8_4_;
      auVar111._12_4_ = auVar107._12_4_ * auVar43._12_4_;
      auVar111._16_4_ = auVar107._16_4_ * auVar43._16_4_;
      auVar111._20_4_ = auVar107._20_4_ * auVar43._20_4_;
      auVar111._28_36_ = auVar110._28_36_;
      auVar111._24_4_ = auVar107._24_4_ * (float)uStack_5b48;
      auVar12 = vfmsub231ps_fma(auVar111._0_32_,auVar105,*(undefined1 (*) [32])pRVar2);
      auVar112._0_4_ = auVar89._0_4_ * auVar44._0_4_;
      auVar112._4_4_ = auVar89._4_4_ * auVar44._4_4_;
      auVar112._8_4_ = auVar89._8_4_ * auVar44._8_4_;
      auVar112._12_4_ = auVar89._12_4_ * auVar44._12_4_;
      auVar112._16_4_ = auVar89._16_4_ * auVar44._16_4_;
      auVar112._20_4_ = auVar89._20_4_ * auVar44._20_4_;
      auVar112._24_4_ = auVar89._24_4_ * fVar98;
      auVar112._28_4_ = 0;
      auVar13 = vfmsub231ps_fma(auVar112,auVar107,*(undefined1 (*) [32])pRVar3);
      in_ZMM13 = ZEXT1664(auVar13);
      auVar21._4_4_ = auVar45._4_4_ * auVar105._4_4_;
      auVar21._0_4_ = auVar45._0_4_ * auVar105._0_4_;
      auVar21._8_4_ = auVar45._8_4_ * auVar105._8_4_;
      auVar21._12_4_ = auVar45._12_4_ * auVar105._12_4_;
      auVar21._16_4_ = auVar45._16_4_ * auVar105._16_4_;
      auVar21._20_4_ = auVar45._20_4_ * auVar105._20_4_;
      auVar21._24_4_ = (float)uStack_5b88 * auVar105._24_4_;
      auVar21._28_4_ = uVar119;
      auVar14 = vfmsub231ps_fma(auVar21,auVar89,*(undefined1 (*) [32])pRVar1);
      auVar22._4_4_ = auVar88._4_4_ * auVar14._4_4_;
      auVar22._0_4_ = auVar88._0_4_ * auVar14._0_4_;
      auVar22._8_4_ = auVar88._8_4_ * auVar14._8_4_;
      auVar22._12_4_ = auVar88._12_4_ * auVar14._12_4_;
      auVar22._16_4_ = auVar88._16_4_ * 0.0;
      auVar22._20_4_ = auVar88._20_4_ * 0.0;
      auVar22._24_4_ = auVar88._24_4_ * 0.0;
      auVar22._28_4_ = auVar88._28_4_;
      auVar60 = vfmadd231ps_fma(auVar22,ZEXT1632(auVar13),auVar73);
      auVar23._4_4_ = auVar17._4_4_ * auVar44._4_4_;
      auVar23._0_4_ = auVar17._0_4_ * auVar44._0_4_;
      auVar23._8_4_ = auVar17._8_4_ * auVar44._8_4_;
      auVar23._12_4_ = auVar17._12_4_ * auVar44._12_4_;
      auVar23._16_4_ = auVar44._16_4_ * 0.0;
      auVar23._20_4_ = auVar44._20_4_ * 0.0;
      auVar23._24_4_ = fVar98 * 0.0;
      auVar23._28_4_ = auVar73._28_4_;
      auVar7 = vfmadd231ps_fma(auVar23,ZEXT1632(auVar16),*(undefined1 (*) [32])pRVar1);
      auVar7 = vfmadd231ps_fma(ZEXT1632(auVar7),ZEXT1632(auVar15),*(undefined1 (*) [32])pRVar3);
      auVar73 = vandps_avx(ZEXT1632(auVar7),local_5ac0);
      auVar60 = vfmadd231ps_fma(ZEXT1632(auVar60),ZEXT1632(auVar12),auVar84);
      uVar113 = auVar73._0_4_;
      auVar102._0_4_ = auVar60._0_4_ ^ uVar113;
      uVar114 = auVar73._4_4_;
      auVar102._4_4_ = auVar60._4_4_ ^ uVar114;
      uVar115 = auVar73._8_4_;
      auVar102._8_4_ = auVar60._8_4_ ^ uVar115;
      uVar116 = auVar73._12_4_;
      auVar102._12_4_ = auVar60._12_4_ ^ uVar116;
      uVar48 = auVar73._16_4_;
      auVar102._16_4_ = uVar48;
      uVar117 = auVar73._20_4_;
      auVar102._20_4_ = uVar117;
      uVar118 = auVar73._24_4_;
      auVar102._24_4_ = uVar118;
      uVar11 = auVar73._28_4_;
      auVar102._28_4_ = uVar11;
      auVar73 = vcmpps_avx(auVar102,_DAT_01faff00,5);
      in_ZMM15 = ZEXT3264(auVar73);
      auVar84 = local_5d80 & auVar73;
      bVar56 = true;
      auVar88 = ZEXT1632(auVar12);
      if ((((((((auVar84 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar84 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar84 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar84 >> 0x7f,0) == '\0') &&
            (auVar84 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar84 >> 0xbf,0) == '\0') &&
          (auVar84 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar84[0x1f])
      {
LAB_00605591:
        auVar73 = vpcmpeqd_avx2(auVar88,auVar88);
        auVar110 = ZEXT3264(auVar73);
      }
      else {
        auVar73 = vandps_avx(auVar73,local_5d80);
        in_ZMM15 = ZEXT3264(auVar73);
        auVar25._4_4_ = auVar14._4_4_ * auVar83._4_4_;
        auVar25._0_4_ = auVar14._0_4_ * auVar83._0_4_;
        auVar25._8_4_ = auVar14._8_4_ * auVar83._8_4_;
        auVar25._12_4_ = auVar14._12_4_ * auVar83._12_4_;
        auVar25._16_4_ = auVar83._16_4_ * 0.0;
        auVar25._20_4_ = auVar83._20_4_ * 0.0;
        auVar25._24_4_ = auVar83._24_4_ * 0.0;
        auVar25._28_4_ = auVar105._28_4_;
        auVar60 = vfmadd213ps_fma(auVar82,ZEXT1632(auVar13),auVar25);
        auVar60 = vfmadd213ps_fma(auVar61,ZEXT1632(auVar12),ZEXT1632(auVar60));
        auVar97._0_4_ = uVar113 ^ auVar60._0_4_;
        auVar97._4_4_ = uVar114 ^ auVar60._4_4_;
        auVar97._8_4_ = uVar115 ^ auVar60._8_4_;
        auVar97._12_4_ = uVar116 ^ auVar60._12_4_;
        auVar97._16_4_ = uVar48;
        auVar97._20_4_ = uVar117;
        auVar97._24_4_ = uVar118;
        auVar97._28_4_ = uVar11;
        auVar84 = vcmpps_avx(auVar97,_DAT_01faff00,5);
        auVar59 = auVar73 & auVar84;
        if ((((((((auVar59 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar59 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar59 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar59 >> 0x7f,0) == '\0') &&
              (auVar59 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar59 >> 0xbf,0) == '\0') &&
            (auVar59 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar59[0x1f]) goto LAB_00605591;
        auVar59 = vandps_avx(ZEXT1632(auVar7),local_5c20);
        auVar73 = vandps_avx(auVar84,auVar73);
        auVar84 = vsubps_avx(auVar59,auVar102);
        auVar84 = vcmpps_avx(auVar84,auVar97,5);
        auVar70 = auVar73 & auVar84;
        auVar88 = vpcmpeqd_avx2(auVar88,auVar88);
        auVar110 = ZEXT3264(auVar88);
        if ((((((((auVar70 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar70 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar70 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar70 >> 0x7f,0) != '\0') ||
              (auVar70 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar70 >> 0xbf,0) != '\0') ||
            (auVar70 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar70[0x1f] < '\0') {
          auVar73 = vandps_avx(auVar73,auVar84);
          auVar86._0_4_ = auVar107._0_4_ * auVar17._0_4_;
          auVar86._4_4_ = auVar107._4_4_ * auVar17._4_4_;
          auVar86._8_4_ = auVar107._8_4_ * auVar17._8_4_;
          auVar86._12_4_ = auVar107._12_4_ * auVar17._12_4_;
          auVar86._16_4_ = auVar107._16_4_ * 0.0;
          auVar86._20_4_ = auVar107._20_4_ * 0.0;
          auVar86._24_4_ = auVar107._24_4_ * 0.0;
          auVar86._28_4_ = 0;
          auVar60 = vfmadd213ps_fma(auVar105,ZEXT1632(auVar16),auVar86);
          auVar60 = vfmadd213ps_fma(auVar89,ZEXT1632(auVar15),ZEXT1632(auVar60));
          auVar58._0_4_ = uVar113 ^ auVar60._0_4_;
          auVar58._4_4_ = uVar114 ^ auVar60._4_4_;
          auVar58._8_4_ = uVar115 ^ auVar60._8_4_;
          auVar58._12_4_ = uVar116 ^ auVar60._12_4_;
          auVar58._16_4_ = uVar48;
          auVar58._20_4_ = uVar117;
          auVar58._24_4_ = uVar118;
          auVar58._28_4_ = uVar11;
          auVar64._0_4_ = auVar59._0_4_ * (float)local_5bc0;
          auVar64._4_4_ = auVar59._4_4_ * local_5bc0._4_4_;
          auVar64._8_4_ = auVar59._8_4_ * (float)uStack_5bb8;
          auVar64._12_4_ = auVar59._12_4_ * uStack_5bb8._4_4_;
          auVar64._16_4_ = auVar59._16_4_ * (float)uStack_5bb0;
          auVar64._20_4_ = auVar59._20_4_ * uStack_5bb0._4_4_;
          auVar64._24_4_ = auVar59._24_4_ * (float)uStack_5ba8;
          auVar64._28_4_ = 0;
          auVar84 = vcmpps_avx(auVar64,auVar58,1);
          auVar71._0_4_ = auVar59._0_4_ * (float)local_5be0;
          auVar71._4_4_ = auVar59._4_4_ * local_5be0._4_4_;
          auVar71._8_4_ = auVar59._8_4_ * (float)uStack_5bd8;
          auVar71._12_4_ = auVar59._12_4_ * uStack_5bd8._4_4_;
          auVar71._16_4_ = auVar59._16_4_ * (float)uStack_5bd0;
          auVar71._20_4_ = auVar59._20_4_ * uStack_5bd0._4_4_;
          auVar71._24_4_ = auVar59._24_4_ * (float)uStack_5bc8;
          auVar71._28_4_ = 0;
          auVar88 = vcmpps_avx(auVar58,auVar71,2);
          auVar84 = vandps_avx(auVar88,auVar84);
          auVar88 = auVar73 & auVar84;
          if ((((((((auVar88 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar88 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar88 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar88 >> 0x7f,0) != '\0') ||
                (auVar88 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar88 >> 0xbf,0) != '\0') ||
              (auVar88 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar88[0x1f] < '\0') {
            auVar73 = vandps_avx(auVar84,auVar73);
            auVar84 = vcmpps_avx(ZEXT1632(auVar7),_DAT_01faff00,4);
            auVar88 = auVar73 & auVar84;
            if ((((((((auVar88 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar88 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar88 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar88 >> 0x7f,0) != '\0') ||
                  (auVar88 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar88 >> 0xbf,0) != '\0') ||
                (auVar88 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar88[0x1f] < '\0') {
              uVar113 = ((context->scene->geometries).items[uVar53].ptr)->mask;
              auVar72._4_4_ = uVar113;
              auVar72._0_4_ = uVar113;
              auVar72._8_4_ = uVar113;
              auVar72._12_4_ = uVar113;
              auVar72._16_4_ = uVar113;
              auVar72._20_4_ = uVar113;
              auVar72._24_4_ = uVar113;
              auVar72._28_4_ = uVar113;
              auVar73 = vandps_avx(auVar84,auVar73);
              auVar84 = vpand_avx2(auVar72,*(undefined1 (*) [32])pRVar4);
              auVar88 = vpcmpeqd_avx2(auVar84,_DAT_01faff00);
              auVar84 = auVar73 & ~auVar88;
              if ((((((((auVar84 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar84 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar84 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar84 >> 0x7f,0) != '\0') ||
                    (auVar84 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar84 >> 0xbf,0) != '\0') ||
                  (auVar84 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar84[0x1f] < '\0') {
                auVar73 = vandnps_avx(auVar88,auVar73);
                auVar84 = local_5d80 & ~auVar73;
                local_5d80 = vandnps_avx(auVar73,local_5d80);
                bVar56 = (((((((auVar84 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                              (auVar84 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                             (auVar84 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            SUB321(auVar84 >> 0x7f,0) != '\0') ||
                           (auVar84 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          SUB321(auVar84 >> 0xbf,0) != '\0') ||
                         (auVar84 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         auVar84[0x1f] < '\0';
              }
            }
          }
        }
      }
      auVar109 = ZEXT3264(CONCAT428(0x7f800000,
                                    CONCAT424(0x7f800000,
                                              CONCAT420(0x7f800000,
                                                        CONCAT416(0x7f800000,
                                                                  CONCAT412(0x7f800000,
                                                                            CONCAT48(0x7f800000,
                                                                                                                                                                          
                                                  0x7f8000007f800000)))))));
      _local_5c80 = auVar83;
      _local_5c60 = auVar82;
      _local_5c40 = auVar61;
      if ((!bVar56) || (bVar56 = 2 < uVar51, uVar51 = uVar51 + 1, bVar56)) break;
    }
    auVar70 = vandps_avx(local_5d80,local_5d40);
    auVar73 = local_5d40 & local_5d80;
    if ((((((((auVar73 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar73 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar73 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar73 >> 0x7f,0) == '\0') &&
          (auVar73 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar73 >> 0xbf,0) == '\0') &&
        (auVar73 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar73[0x1f])
    break;
  }
  auVar59._0_4_ = auVar110._0_4_ ^ auVar70._0_4_;
  auVar59._4_4_ = auVar110._4_4_ ^ auVar70._4_4_;
  auVar59._8_4_ = auVar110._8_4_ ^ auVar70._8_4_;
  auVar59._12_4_ = auVar110._12_4_ ^ auVar70._12_4_;
  auVar59._16_4_ = auVar110._16_4_ ^ auVar70._16_4_;
  auVar59._20_4_ = auVar110._20_4_ ^ auVar70._20_4_;
  auVar59._24_4_ = auVar110._24_4_ ^ auVar70._24_4_;
  auVar59._28_4_ = auVar110._28_4_ ^ auVar70._28_4_;
  local_5be0 = uVar31;
  uStack_5bd8 = uVar32;
  uStack_5bd0 = uVar33;
  local_5bc0 = uVar28;
  uStack_5bb8 = uVar29;
  uStack_5bb0 = uVar30;
LAB_0060583f:
  local_5d00 = vorps_avx(local_5d00,auVar59);
  auVar73 = auVar110._0_32_ & ~local_5d00;
  if ((((((((auVar73 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
           (auVar73 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
          (auVar73 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
         SUB321(auVar73 >> 0x7f,0) == '\0') &&
        (auVar73 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
       SUB321(auVar73 >> 0xbf,0) == '\0') &&
      (auVar73 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar73[0x1f])
  goto LAB_00605985;
  auVar65._8_4_ = 0xff800000;
  auVar65._0_8_ = 0xff800000ff800000;
  auVar65._12_4_ = 0xff800000;
  auVar65._16_4_ = 0xff800000;
  auVar65._20_4_ = 0xff800000;
  auVar65._24_4_ = 0xff800000;
  auVar65._28_4_ = 0xff800000;
  local_5840 = vblendvps_avx(local_5840,auVar65,local_5d00);
  goto LAB_00604fe9;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }